

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON_StringLengthUTF32(ON__UINT32 *string)

{
  ON__UINT32 *local_18;
  ON__UINT32 *string1;
  ON__UINT32 *string_local;
  
  local_18 = string;
  if (string != (ON__UINT32 *)0x0) {
    for (; *local_18 != 0; local_18 = local_18 + 1) {
    }
  }
  return (int)((long)local_18 - (long)string >> 2);
}

Assistant:

int ON_StringLengthUTF32(
  const ON__UINT32* string
  )
{
  const ON__UINT32* string1 = string;
  if (nullptr != string1)
  {
    while (0 != *string1)
      string1++;
  }
  return (int)(string1 - string);
}